

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction_X86.cpp
# Opt level: O2

int __thiscall
x86Argument::Decode(x86Argument *this,CodeGenRegVmStateContext *ctx,char *buf,uint bufSize,bool x64,
                   bool useMmWord,bool skipSize)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  x86Reg xVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  undefined1 *puVar8;
  CodeGenRegVmStateContext *pCVar9;
  uint *puVar10;
  char *pcVar11;
  char *src;
  int iVar12;
  size_t sVar13;
  char *pcVar14;
  ulong size;
  undefined1 *puVar15;
  
  size = (ulong)bufSize;
  iVar12 = (int)buf;
  puVar15 = (anonymous_namespace)::x86RegText;
  pcVar11 = buf;
  switch(this->type) {
  case argNumber:
    if (ctx->vsAsmStyle != true) {
      pCVar9 = (CodeGenRegVmStateContext *)(long)(this->field_1).num;
      if (pCVar9 == (CodeGenRegVmStateContext *)&ctx->callInstructionPos) {
        pcVar11 = "&ctx.callInstructionPos";
      }
      else if (pCVar9 == (CodeGenRegVmStateContext *)&ctx->dataStackTop) {
        pcVar11 = "&ctx.dataStackTop";
      }
      else if (pCVar9 == (CodeGenRegVmStateContext *)&ctx->callStackTop) {
        pcVar11 = "&ctx.callStackTop";
      }
      else if (pCVar9 == (CodeGenRegVmStateContext *)&ctx->regFileLastTop) {
        pcVar11 = "&ctx.regFileLastTop";
      }
      else if (pCVar9 == (CodeGenRegVmStateContext *)&ctx->regFileLastPtr) {
        pcVar11 = "&ctx.regFileLastPtr";
      }
      else if (pCVar9 == (CodeGenRegVmStateContext *)ctx->dataStackBase) {
        pcVar11 = "ctx.dataStackBase";
      }
      else if (pCVar9 == (CodeGenRegVmStateContext *)ctx->ctx->exRegVmConstants) {
        pcVar11 = "ctx.exRegVmConstants";
      }
      else {
        if (pCVar9 != ctx) {
          pcVar11 = "%d";
          goto LAB_001858f2;
        }
        pcVar11 = "&ctx";
      }
      goto LAB_00185cae;
    }
    pcVar11 = "";
    if (9 < (this->field_1).num) {
      pcVar11 = "h";
    }
    iVar5 = NULLC::SafeSprintf(buf,size,"%x%s",(ulong)(uint)(this->field_1).num,pcVar11);
    break;
  case argReg:
    if (x64) {
      puVar15 = (anonymous_namespace)::x64RegText;
    }
    pcVar11 = *(char **)(puVar15 + (ulong)(this->field_1).reg * 8);
    goto LAB_001858bc;
  case argXmmReg:
    pcVar11 = _ZN12_GLOBAL__N_113x86XmmRegTextE_rel +
              *(int *)(_ZN12_GLOBAL__N_113x86XmmRegTextE_rel + (ulong)(this->field_1).reg * 4);
LAB_001858bc:
    strcpy(buf,pcVar11);
    sVar6 = strlen(buf);
    pcVar11 = buf + sVar6;
    goto switchD_00185700_default;
  case argPtr:
    if (!skipSize) {
      puVar8 = (anonymous_namespace)::x86SizeText;
      if (useMmWord) {
        puVar8 = (anonymous_namespace)::x86XmmSizeText;
      }
      strcpy(buf,*(char **)(puVar8 + (ulong)(this->field_1).reg * 8));
      sVar6 = strlen(buf);
      pcVar11 = buf + sVar6;
      if (ctx->vsAsmStyle == true) {
        builtin_strncpy(buf + sVar6," ptr",4);
        pcVar11 = pcVar11 + 4;
      }
      *pcVar11 = ' ';
      pcVar11 = pcVar11 + 1;
    }
    pcVar11[0] = '[';
    pcVar11[1] = '\0';
    pcVar11 = pcVar11 + 1;
    if (ctx->vsAsmStyle == false) {
      if ((ulong)this->ptrIndex != 0) {
        puVar8 = (anonymous_namespace)::x86RegText;
        if (x64) {
          puVar8 = (anonymous_namespace)::x64RegText;
        }
        strcpy(pcVar11,*(char **)(puVar8 + (ulong)this->ptrIndex * 8));
        sVar6 = strlen(pcVar11);
        pcVar11 = pcVar11 + sVar6;
      }
      if (1 < this->ptrMult) {
        iVar5 = NULLC::SafeSprintf(pcVar11,(ulong)((iVar12 - (int)pcVar11) + bufSize),"*%d");
        pcVar11 = pcVar11 + iVar5;
      }
    }
    uVar7 = (ulong)this->ptrBase;
    if (uVar7 != 0) {
      if (ctx->vsAsmStyle == true) {
        puVar8 = (anonymous_namespace)::x86RegText;
        if (x64) {
          puVar8 = (anonymous_namespace)::x64RegText;
        }
        iVar5 = NULLC::SafeSprintf(pcVar11,(ulong)((iVar12 - (int)pcVar11) + bufSize),"%s",
                                   *(undefined8 *)(puVar8 + uVar7 * 8));
        pcVar11 = pcVar11 + iVar5;
      }
      else {
        puVar8 = (anonymous_namespace)::x86RegText;
        if (x64) {
          puVar8 = (anonymous_namespace)::x64RegText;
        }
        if (this->ptrIndex == rNONE) {
          pcVar14 = "%s";
        }
        else {
          pcVar14 = " + %s";
        }
        iVar5 = NULLC::SafeSprintf(pcVar11,(ulong)((iVar12 - (int)pcVar11) + bufSize),pcVar14,
                                   *(undefined8 *)(puVar8 + uVar7 * 8));
        pcVar11 = pcVar11 + iVar5;
      }
    }
    if (ctx->vsAsmStyle == true) {
      xVar4 = this->ptrIndex;
      if (xVar4 != rNONE) {
        if (this->ptrBase != rNONE) {
          *pcVar11 = '+';
          pcVar11 = pcVar11 + 1;
          xVar4 = this->ptrIndex;
        }
        if (x64) {
          puVar15 = (anonymous_namespace)::x64RegText;
        }
        strcpy(pcVar11,*(char **)(puVar15 + (ulong)xVar4 * 8));
        sVar6 = strlen(pcVar11);
        pcVar11 = pcVar11 + sVar6;
      }
      if (1 < this->ptrMult) {
        iVar5 = NULLC::SafeSprintf(pcVar11,(ulong)((iVar12 - (int)pcVar11) + bufSize),"*%d");
        pcVar11 = pcVar11 + iVar5;
      }
    }
    iVar5 = (int)pcVar11;
    if (this->ptrBase == rNONE && this->ptrIndex == rNONE) {
      if (ctx->vsAsmStyle == true) {
        sVar13 = (size_t)((iVar12 - iVar5) + bufSize);
        uVar7 = (ulong)(uint)this->ptrNum;
        pcVar14 = "";
        if (9 < this->ptrNum) {
          pcVar14 = "h";
        }
        src = "%x%s";
LAB_00185afc:
        iVar5 = NULLC::SafeSprintf(pcVar11,sVar13,src,uVar7,pcVar14);
      }
      else {
        iVar2 = this->ptrNum;
        puVar10 = (uint *)(long)iVar2;
        if ((puVar10 < ctx->tempStackArrayBase) || (ctx->tempStackArrayEnd <= puVar10)) {
          if ((puVar10 < ctx->dataStackBase) || (ctx->dataStackEnd <= puVar10)) {
            puVar3 = ctx->ctx->exRegVmConstants;
            if ((puVar10 < puVar3) || (ctx->ctx->exRegVmConstantsEnd <= puVar10)) {
              if (puVar10 == &ctx->callInstructionPos) {
                sVar13 = (size_t)((iVar12 - iVar5) + bufSize);
                pcVar14 = "&ctx.callInstructionPos";
              }
              else if ((char **)puVar10 == &ctx->dataStackTop) {
                sVar13 = (size_t)((iVar12 - iVar5) + bufSize);
                pcVar14 = "&ctx.dataStackTop";
              }
              else if ((CodeGenRegVmCallStackEntry **)puVar10 == &ctx->callStackTop) {
                sVar13 = (size_t)((iVar12 - iVar5) + bufSize);
                pcVar14 = "&ctx.callStackTop";
              }
              else if ((RegVmRegister **)puVar10 == &ctx->regFileLastTop) {
                sVar13 = (size_t)((iVar12 - iVar5) + bufSize);
                pcVar14 = "&ctx.regFileLastTop";
              }
              else if ((RegVmRegister **)puVar10 == &ctx->regFileLastPtr) {
                sVar13 = (size_t)((iVar12 - iVar5) + bufSize);
                pcVar14 = "&ctx.regFileLastPtr";
              }
              else if ((_func_void_CodeGenRegVmStateContext_ptr_uint **)puVar10 == &ctx->callWrap) {
                sVar13 = (size_t)((iVar12 - iVar5) + bufSize);
                pcVar14 = "&ctx.callWrap";
              }
              else {
                if ((_func_void_CodeGenRegVmStateContext_ptr_uintptr_t_uint **)puVar10 !=
                    &ctx->checkedReturnWrap) {
                  if ((_func_void_CodeGenRegVmStateContext_ptr_uint_uint **)puVar10 ==
                      &ctx->convertPtrWrap) {
                    sVar13 = (size_t)((iVar12 - iVar5) + bufSize);
                    pcVar14 = "&ctx.convertPtrWrap";
LAB_00185dac:
                    iVar5 = NULLC::SafeSprintf(pcVar11,sVar13,pcVar14);
                  }
                  else {
                    if ((_func_void_CodeGenRegVmStateContext_ptr **)puVar10 ==
                        &ctx->errorOutOfBoundsWrap) {
                      sVar13 = (size_t)((iVar12 - iVar5) + bufSize);
                      pcVar14 = "&ctx.errorOutOfBoundsWrap";
                      goto LAB_00185dac;
                    }
                    sVar13 = (size_t)((iVar12 - iVar5) + bufSize);
                    if ((_func_void_CodeGenRegVmStateContext_ptr **)puVar10 ==
                        &ctx->errorNoReturnWrap) {
                      pcVar14 = "&ctx.errorNoReturnWrap";
                      goto LAB_00185dac;
                    }
                    iVar5 = NULLC::SafeSprintf(pcVar11,sVar13,"%d");
                  }
                  pcVar11 = pcVar11 + iVar5;
                  goto LAB_00185b73;
                }
                sVar13 = (size_t)((iVar12 - iVar5) + bufSize);
                pcVar14 = "&ctx.checkedReturnWrap";
              }
              iVar5 = NULLC::SafeSprintf(pcVar11,sVar13,pcVar14);
              goto LAB_00185b6e;
            }
            sVar13 = (size_t)((iVar12 - iVar5) + bufSize);
            uVar7 = (ulong)(uint)(iVar2 - (int)puVar3);
            pcVar14 = "constants+%u";
          }
          else {
            sVar13 = (size_t)((iVar12 - iVar5) + bufSize);
            uVar7 = (ulong)(uint)(iVar2 - (int)ctx->dataStackBase);
            pcVar14 = "globals+%u";
          }
        }
        else {
          sVar13 = (size_t)((iVar12 - iVar5) + bufSize);
          uVar7 = (ulong)(uint)(iVar2 - (int)ctx->tempStackArrayBase);
          pcVar14 = "temp+%u";
        }
LAB_00185b67:
        iVar5 = NULLC::SafeSprintf(pcVar11,sVar13,pcVar14,uVar7);
      }
LAB_00185b6e:
      pcVar11 = pcVar11 + iVar5;
    }
    else {
      uVar1 = this->ptrNum;
      uVar7 = (ulong)uVar1;
      if (uVar1 != 0) {
        sVar13 = (size_t)((iVar12 - iVar5) + bufSize);
        if (ctx->vsAsmStyle != true) {
          pcVar14 = "%+d";
          goto LAB_00185b67;
        }
        pcVar14 = "";
        if (9 < (int)uVar1) {
          pcVar14 = "h";
        }
        src = "+%x%s";
        goto LAB_00185afc;
      }
    }
LAB_00185b73:
    pcVar11[0] = ']';
    pcVar11[1] = '\0';
    pcVar11 = pcVar11 + 1;
    goto switchD_00185700_default;
  case argPtrLabel:
    iVar5 = NULLC::SafeSprintf(buf,size,"[\'0x%x\'+%d]",(ulong)(this->field_1).reg,
                               (ulong)(uint)this->ptrNum);
    break;
  case argLabel:
    pCVar9 = (CodeGenRegVmStateContext *)(ulong)(this->field_1).reg;
    pcVar11 = "\'0x%x\'";
LAB_001858f2:
    iVar5 = NULLC::SafeSprintf(buf,size,pcVar11,pCVar9);
    break;
  case argImm64:
    pCVar9 = (CodeGenRegVmStateContext *)(this->field_1).imm64Arg;
    if (pCVar9 == ctx) {
      pcVar11 = "&ctx";
    }
    else if (pCVar9 == (CodeGenRegVmStateContext *)&ctx->tempStackArrayBase) {
      pcVar11 = "&ctx.tempStackArrayBase";
    }
    else {
      if (pCVar9 != (CodeGenRegVmStateContext *)ctx->tempStackArrayBase) {
        if (ctx->vsAsmStyle == true) {
          pcVar11 = "%llXh";
        }
        else {
          pcVar11 = "%lld";
        }
        iVar5 = NULLC::SafeSprintf(buf,size,pcVar11);
        break;
      }
      pcVar11 = "ctx.tempStackArrayBase";
    }
LAB_00185cae:
    iVar5 = NULLC::SafeSprintf(buf,size,pcVar11);
    break;
  default:
    goto switchD_00185700_default;
  }
  pcVar11 = buf + iVar5;
switchD_00185700_default:
  if (pcVar11 < buf + size) {
    __assert_fail("buf + bufSize <= curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Instruction_X86.cpp"
                  ,0xd2,
                  "int x86Argument::Decode(CodeGenRegVmStateContext &, char *, unsigned int, bool, bool, bool)"
                 );
  }
  return (int)pcVar11 - iVar12;
}

Assistant:

int x86Argument::Decode(CodeGenRegVmStateContext &ctx, char *buf, unsigned bufSize, bool x64, bool useMmWord, bool skipSize)
{
	char *curr = buf;

	if(type == argNumber)
	{
		if(ctx.vsAsmStyle)
		{
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%x%s", num, num > 9 ? "h" : "");
		}
		else
		{
			if(uintptr_t(num) == uintptr_t(&ctx.callInstructionPos))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callInstructionPos");
			else if(uintptr_t(num) == uintptr_t(&ctx.dataStackTop))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.dataStackTop");
			else if(uintptr_t(num) == uintptr_t(&ctx.callStackTop))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callStackTop");
			else if(uintptr_t(num) == uintptr_t(&ctx.regFileLastTop))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.regFileLastTop");
			else if(uintptr_t(num) == uintptr_t(&ctx.regFileLastPtr))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.regFileLastPtr");
			else if(uintptr_t(num) == uintptr_t(ctx.dataStackBase))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "ctx.dataStackBase");
			else if(uintptr_t(num) == uintptr_t(ctx.ctx->exRegVmConstants))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "ctx.exRegVmConstants");
			else if(uintptr_t(num) == uintptr_t(&ctx))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx");
			else
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%d", num);
		}
	}
	else if(type == argReg)
	{
		strcpy(curr, (x64 ? x64RegText : x86RegText)[reg]);
		curr += strlen(curr);
	}
	else if(type == argXmmReg)
	{
		strcpy(curr, x86XmmRegText[xmmArg]);
		curr += strlen(curr);
	}
	else if(type == argLabel)
	{
		curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "'0x%x'", labelID);
	}
	else if(type == argPtrLabel)
	{
		curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "['0x%x'+%d]", labelID, ptrNum);
	}
	else if(type == argPtr)
	{
		if(!skipSize)
		{
			strcpy(curr, (useMmWord ? x86XmmSizeText : x86SizeText)[ptrSize]);
			curr += strlen(curr);

			if(ctx.vsAsmStyle)
			{
				*curr++ = ' ';
				*curr++ = 'p';
				*curr++ = 't';
				*curr++ = 'r';
			}

			*curr++ = ' ';
		}

		*curr++ = '[';
		*curr = 0;

		if(!ctx.vsAsmStyle)
		{
			if(ptrIndex != rNONE)
			{
				strcpy(curr, (x64 ? x64RegText : x86RegText)[ptrIndex]);
				curr += strlen(curr);
			}

			if(ptrMult > 1)
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "*%d", ptrMult);
		}

		if(ptrBase != rNONE)
		{
			if(ctx.vsAsmStyle)
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%s", (x64 ? x64RegText : x86RegText)[ptrBase]);
			else if(ptrIndex != rNONE)
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), " + %s", (x64 ? x64RegText : x86RegText)[ptrBase]);
			else
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%s", (x64 ? x64RegText : x86RegText)[ptrBase]);
		}

		if(ctx.vsAsmStyle)
		{
			if(ptrIndex != rNONE)
			{
				if(ptrBase != rNONE)
					*curr++ = '+';

				strcpy(curr, (x64 ? x64RegText : x86RegText)[ptrIndex]);
				curr += strlen(curr);
			}

			if(ptrMult > 1)
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "*%d", ptrMult);
		}

		if(ptrIndex == rNONE && ptrBase == rNONE && ctx.vsAsmStyle)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%x%s", ptrNum, ptrNum > 9 ? "h" : "");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) >= uintptr_t(ctx.tempStackArrayBase) && uintptr_t(ptrNum) < uintptr_t(ctx.tempStackArrayEnd))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "temp+%u", unsigned(ptrNum - uintptr_t(ctx.tempStackArrayBase)));
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) >= uintptr_t(ctx.dataStackBase) && uintptr_t(ptrNum) < uintptr_t(ctx.dataStackEnd))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "globals+%u", unsigned(ptrNum - uintptr_t(ctx.dataStackBase)));
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) >= uintptr_t(ctx.ctx->exRegVmConstants) && uintptr_t(ptrNum) < uintptr_t(ctx.ctx->exRegVmConstantsEnd))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "constants+%u", unsigned(ptrNum - uintptr_t(ctx.ctx->exRegVmConstants)));
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.callInstructionPos))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callInstructionPos");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.dataStackTop))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.dataStackTop");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.callStackTop))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callStackTop");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.regFileLastTop))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.regFileLastTop");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.regFileLastPtr))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.regFileLastPtr");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.callWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.checkedReturnWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.checkedReturnWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.convertPtrWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.convertPtrWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.errorOutOfBoundsWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.errorOutOfBoundsWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.errorNoReturnWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.errorNoReturnWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%d", ptrNum);
		else if(ptrNum != 0 && ctx.vsAsmStyle)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "+%x%s", ptrNum, ptrNum > 9 ? "h" : "");
		else if(ptrNum != 0)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%+d", ptrNum);

		*curr++ = ']';
		*curr = 0;
	}
	else if(type == argImm64)
	{
		if(imm64Arg == uintptr_t(&ctx))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx");
		else if(imm64Arg == uintptr_t(&ctx.tempStackArrayBase))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.tempStackArrayBase");
		else if(imm64Arg == uintptr_t(ctx.tempStackArrayBase))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "ctx.tempStackArrayBase");
		else if(ctx.vsAsmStyle)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%llXh", (unsigned long long)imm64Arg);
		else
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%lld", (long long)imm64Arg);
	}

	assert(buf + bufSize <= curr);
	return int(curr - buf);
}